

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_data.cpp
# Opt level: O3

void MapOptHandler_skyrotate(FMapInfoParser *parse,level_info_t *info)

{
  FGLROptions *pFVar1;
  FName local_1c;
  
  local_1c.Index = FName::NameManager::FindName(&FName::NameData,"gl_renderer",false);
  pFVar1 = level_info_t::GetOptData<FGLROptions>(info,&local_1c,true);
  FMapInfoParser::ParseAssign(parse);
  FScanner::MustGetFloat(&parse->sc);
  (pFVar1->skyrotatevector).X = (float)(parse->sc).Float;
  if (parse->format_type == 2) {
    FScanner::MustGetStringName(&parse->sc,",");
  }
  FScanner::MustGetFloat(&parse->sc);
  (pFVar1->skyrotatevector).Y = (float)(parse->sc).Float;
  if (parse->format_type == 2) {
    FScanner::MustGetStringName(&parse->sc,",");
  }
  FScanner::MustGetFloat(&parse->sc);
  (pFVar1->skyrotatevector).Z = (float)(parse->sc).Float;
  TVector3<float>::MakeUnit(&pFVar1->skyrotatevector);
  return;
}

Assistant:

DEFINE_MAP_OPTION(skyrotate, false)
{
	FGLROptions *opt = info->GetOptData<FGLROptions>("gl_renderer");

	parse.ParseAssign();
	parse.sc.MustGetFloat();
	opt->skyrotatevector.X = (float)parse.sc.Float;
	if (parse.format_type == FMapInfoParser::FMT_New) parse.sc.MustGetStringName(","); 
	parse.sc.MustGetFloat();
	opt->skyrotatevector.Y = (float)parse.sc.Float;
	if (parse.format_type == FMapInfoParser::FMT_New) parse.sc.MustGetStringName(","); 
	parse.sc.MustGetFloat();
	opt->skyrotatevector.Z = (float)parse.sc.Float;
	opt->skyrotatevector.MakeUnit();
}